

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Nodes_ExtractInsert_Test::TestBody(Nodes_ExtractInsert_Test *this)

{
  string *psVar1;
  char (*__x) [27];
  long *plVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  char cVar6;
  ulong uVar7;
  undefined8 extraout_RAX;
  size_t sVar8;
  size_t sVar9;
  iterator *piVar10;
  undefined1 uVar11;
  ulong uVar12;
  iterator *extraout_RDX;
  iterator *extraout_RDX_00;
  iterator *extraout_RDX_01;
  iterator *extraout_RDX_02;
  iterator *extraout_RDX_03;
  iterator *value;
  iterator *value_00;
  anon_union_8_1_a8a14541_for_iterator_1 extraout_RDX_04;
  byte bVar13;
  char *pcVar14;
  size_t hashval;
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  char *in_R9;
  ctrl_t *pcVar17;
  long lVar18;
  pointer *__ptr_9;
  __m128i match;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  const_iterator it;
  node_handle<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>,_void>
  node_1;
  StringTable t2;
  StringTable t;
  insert_return_type res;
  node_type node;
  char k0 [28];
  char k2 [27];
  char k1 [27];
  AssertHelper local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  undefined1 local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  AssertHelper local_278 [2];
  undefined1 local_268 [8];
  anon_union_8_1_a8a14541_for_iterator_1 aStack_260;
  undefined1 local_258 [80];
  undefined1 local_208 [24];
  size_t sStack_1f0;
  _Head_base<0UL,_unsigned_long,_false> local_1e0;
  undefined1 local_1d8 [24];
  ulong uStack_1c0;
  _Head_base<0UL,_unsigned_long,_false> local_1b0;
  undefined1 local_1a8 [24];
  undefined1 local_190 [16];
  char *local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 local_e8 [9];
  char local_df;
  undefined1 local_98 [64];
  char local_58 [40];
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  
  local_98._16_4_ = 0x6e697274;
  local_98[0x14] = 'g';
  local_98[0x15] = ' ';
  local_98[0x16] = 'z';
  local_98[0x17] = 'e';
  local_98[0x18] = 'r';
  local_98[0x19] = 'o';
  local_98[0x1a] = '.';
  local_98[0x1b] = '\0';
  local_98[0] = 'V';
  local_98[1] = 'e';
  local_98[2] = 'r';
  local_98[3] = 'y';
  local_98[4] = ' ';
  local_98[5] = 'l';
  local_98[6] = 'o';
  local_98[7] = 'n';
  local_98[8] = 'g';
  local_98[9] = ' ';
  local_98[10] = 's';
  local_98[0xb] = 't';
  local_98[0xc] = 'd';
  local_98[0xd] = ':';
  local_98[0xe] = ':';
  local_98[0xf] = 's';
  builtin_strncpy(local_58 + 0x10,"tring one.",0xb);
  builtin_strncpy(local_58,"Very long std::s",0x10);
  local_98._48_3_ = 0x697274;
  local_98[0x33] = 'n';
  local_98[0x34] = 'g';
  local_98[0x35] = ' ';
  local_98[0x36] = 't';
  local_98[0x37] = 'w';
  local_98[0x38] = 'o';
  local_98[0x39] = '.';
  local_98[0x3a] = '\0';
  local_98[0x20] = 'V';
  local_98[0x21] = 'e';
  local_98[0x22] = 'r';
  local_98[0x23] = 'y';
  local_98[0x24] = ' ';
  local_98[0x25] = 'l';
  local_98[0x26] = 'o';
  local_98[0x27] = 'n';
  local_98._40_3_ = 0x732067;
  local_98._43_5_ = 0x733a3a6474;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[28],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,(char (*) [28])local_98,(char (*) [1])0x1909e8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>
            (&local_168,(char (*) [27])local_58,(char (*) [1])0x1909e8);
  pcVar14 = "";
  __x = (char (*) [27])(local_98 + 0x20);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[1],_true>(&local_128,__x,(char (*) [1])0x1909e8);
  local_1b0._M_head_impl = 0;
  local_1d8._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffe38 = (undefined1  [16])0x0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::
  insert<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_0>
            ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_1d8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1a8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e8);
  lVar18 = -0xc0;
  paVar15 = &local_128.second.field_2;
  do {
    if (paVar15 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar15->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar15->_M_allocated_capacity)[-2],
                      paVar15->_M_allocated_capacity + 1);
    }
    if (&paVar15->_M_allocated_capacity + -4 != (size_type *)(&paVar15->_M_allocated_capacity)[-6])
    {
      operator_delete((size_type *)(&paVar15->_M_allocated_capacity)[-6],
                      (&paVar15->_M_allocated_capacity)[-4] + 1);
    }
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar15->_M_allocated_capacity + -8);
    lVar18 = lVar18 + 0x40;
  } while (lVar18 != 0);
  local_1a8._8_8_ = "";
  local_190._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_180 = "";
  local_1a8._0_8_ = __x;
  local_1a8._16_8_ = (char (*) [27])local_58;
  local_190._8_8_ = (char (*) [28])local_98;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_268,local_1a8,(StringTable *)0x190d47);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c4,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_e8 + 8),(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 8));
    if ((char (*) [27])local_1a8._0_8_ != (char (*) [27])0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            ((node_type *)(local_e8 + 8),
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_1d8,(key_arg<char[28]> *)local_98);
  pcVar14 = "";
  local_1a8._8_8_ = "";
  local_190._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_1a8._0_8_ = __x;
  local_1a8._16_8_ = (char (*) [27])local_58;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_268,local_1a8,(StringTable *)0x190d47);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c7,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
    if ((char (*) [27])local_1a8._0_8_ != (char (*) [27])0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  aStack_260.slot_ = (slot_type *)0x0;
  if (local_df == '\0') {
    testing::Message::Message((Message *)local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)local_268,(AssertionResult *)0x18880b,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c8,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if ((char (*) [27])local_1a8._0_8_ != (char (*) [27])(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if ((AssertHelperData *)local_208._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_208._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&aStack_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   aStack_260.slot_);
    }
  }
  local_268[0] = (internal)local_df;
  aStack_260.slot_ = (slot_type *)0x0;
  if (local_df == '\0') {
    testing::Message::Message((Message *)local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)local_268,(AssertionResult *)"node.empty()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6c9,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if ((char (*) [27])local_1a8._0_8_ != (char (*) [27])(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    if ((AssertHelperData *)local_208._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_208._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&aStack_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   aStack_260.slot_);
    }
  }
  local_1e0._M_head_impl = 0;
  local_208._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffe08 = (undefined1  [16])0x0;
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_1a8,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_208,(node_type *)(local_e8 + 8));
  local_298[0] = (internal)local_1a8[0x10];
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8[0x10] == '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.inserted","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cd,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,local_258._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  pcVar14 = "";
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1909e8;
  local_298 = (undefined1  [8])local_98;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_268,local_298,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ce,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_298 != (undefined1  [8])0x0) {
      (**(code **)((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_298)->first)._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  local_298 = (undefined1  [8])(CONCAT71(local_298._1_7_,local_190[1]) ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_190[1] != '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.node","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6cf,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,local_258._0_8_ + 1);
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  pcVar14 = "";
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1909e8;
  local_298 = (undefined1  [8])local_98;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_268,local_298,(StringTable *)local_208);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d0,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_298 != (undefined1  [8])0x0) {
      (**(code **)((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_298)->first)._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  pcVar14 = "";
  aStack_260.slot_ = (slot_type *)0x1909e8;
  local_258._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_268 = (undefined1  [8])__x;
  local_258._0_8_ = (char (*) [27])local_58;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_298,local_268,(StringTable *)0x190d47);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d3,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_268 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  uVar7 = std::_Hash_bytes("Not there!",10,0xc70f6907);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar7;
  if ((ctrl_t *)local_1d8._0_8_ != (ctrl_t *)0x0) {
    if ((uStack_1c0 + 1 & uStack_1c0) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar12 = SUB168(auVar19 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar19 * ZEXT816(0xde5fb9d2630458e9),0);
    uVar7 = uVar12 >> 7 ^ (ulong)local_1d8._0_8_ >> 0xc;
    uVar11 = (undefined1)uVar12;
    auVar19 = ZEXT216(CONCAT11(uVar11,uVar11) & 0x7f7f);
    auVar19 = pshuflw(auVar19,auVar19,0);
    lVar18 = 0;
    while( true ) {
      uVar7 = uVar7 & uStack_1c0;
      pcVar14 = (char *)(local_1d8._0_8_ + uVar7);
      cVar6 = pcVar14[0xf];
      cVar21 = auVar19[0];
      auVar22[0] = -(cVar21 == *pcVar14);
      cVar23 = auVar19[1];
      auVar22[1] = -(cVar23 == pcVar14[1]);
      cVar24 = auVar19[2];
      auVar22[2] = -(cVar24 == pcVar14[2]);
      cVar25 = auVar19[3];
      auVar22[3] = -(cVar25 == pcVar14[3]);
      auVar22[4] = -(cVar21 == pcVar14[4]);
      auVar22[5] = -(cVar23 == pcVar14[5]);
      auVar22[6] = -(cVar24 == pcVar14[6]);
      auVar22[7] = -(cVar25 == pcVar14[7]);
      auVar22[8] = -(cVar21 == pcVar14[8]);
      auVar22[9] = -(cVar23 == pcVar14[9]);
      auVar22[10] = -(cVar24 == pcVar14[10]);
      auVar22[0xb] = -(cVar25 == pcVar14[0xb]);
      auVar22[0xc] = -(cVar21 == pcVar14[0xc]);
      auVar22[0xd] = -(cVar23 == pcVar14[0xd]);
      auVar22[0xe] = -(cVar24 == pcVar14[0xe]);
      auVar22[0xf] = -(cVar25 == cVar6);
      uVar5 = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf;
      if (uVar5 != 0) {
        in_R9 = (char *)(ulong)uVar5;
        do {
          uVar3 = 0;
          uVar16 = (uint)in_R9;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar12 = uVar3 + uVar7 & uStack_1c0;
          if (((((slot_type *)(local_1d8._8_8_ + uVar12 * 0x40))->pair).first._M_string_length == 10
              ) && (plVar2 = (long *)(((slot_type *)(local_1d8._8_8_ + uVar12 * 0x40))->pair).first.
                                     _M_dataplus._M_p,
                   (short)plVar2[1] == 0x2165 && *plVar2 == 0x7265687420746f4e)) {
            if (uVar12 == uStack_1c0) goto LAB_00139e37;
            pcVar17 = (ctrl_t *)(local_1d8._0_8_ + uVar12);
            local_268[1] = true;
            hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,void>::
            transfer<std::allocator<int>>
                      ((allocator<int> *)&aStack_260,(slot_type *)(local_1d8._8_8_ + uVar12 * 0x40),
                       (slot_type *)local_1d8._8_8_);
            it.inner_.field_1.slot_ = extraout_RDX_04.slot_;
            it.inner_.ctrl_ = pcVar17;
            raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            ::erase_meta_only((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                               *)local_1d8,it);
            goto LAB_00139e3c;
          }
          uVar16 = uVar16 - 1 & uVar16;
          in_R9 = (char *)(ulong)uVar16;
        } while (uVar16 != 0);
      }
      auVar20[0] = -(*pcVar14 == -0x80);
      auVar20[1] = -(pcVar14[1] == -0x80);
      auVar20[2] = -(pcVar14[2] == -0x80);
      auVar20[3] = -(pcVar14[3] == -0x80);
      auVar20[4] = -(pcVar14[4] == -0x80);
      auVar20[5] = -(pcVar14[5] == -0x80);
      auVar20[6] = -(pcVar14[6] == -0x80);
      auVar20[7] = -(pcVar14[7] == -0x80);
      auVar20[8] = -(pcVar14[8] == -0x80);
      auVar20[9] = -(pcVar14[9] == -0x80);
      auVar20[10] = -(pcVar14[10] == -0x80);
      auVar20[0xb] = -(pcVar14[0xb] == -0x80);
      auVar20[0xc] = -(pcVar14[0xc] == -0x80);
      auVar20[0xd] = -(pcVar14[0xd] == -0x80);
      auVar20[0xe] = -(pcVar14[0xe] == -0x80);
      auVar20[0xf] = -(cVar6 == -0x80);
      if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80)
      break;
      uVar7 = uVar7 + lVar18 + 0x10;
      lVar18 = lVar18 + 0x10;
    }
  }
LAB_00139e37:
  local_268[1] = 0;
LAB_00139e3c:
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_e8 + 8),
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_268);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)local_268);
  pcVar14 = "";
  aStack_260.slot_ = (slot_type *)0x1909e8;
  local_258._8_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  local_268 = (undefined1  [8])__x;
  local_258._0_8_ = (char (*) [27])local_58;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_298,local_268,(StringTable *)0x190d47);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d5,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_268 + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_298 = (undefined1  [8])(CONCAT71(local_298._1_7_,local_df) ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_df != '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)0x18880b,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6d6,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_268,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_208,(node_type *)(local_e8 + 8));
  local_1a8[0x10] = local_258[0];
  local_1a8._0_8_ = local_268;
  local_1a8._8_8_ = aStack_260;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_190,
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_258 + 8));
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_258 + 8));
  piVar10 = (iterator *)
            (CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1a8[0x10]) & 0xffffffff ^ 1);
  local_298[0] = (internal)(char)piVar10;
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  value = extraout_RDX;
  if (local_1a8[0x10] != '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    piVar10 = (iterator *)0x6da;
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6da,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    value = extraout_RDX_00;
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
      value = extraout_RDX_01;
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
      value = extraout_RDX_02;
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
      value = extraout_RDX_03;
    }
  }
  local_278[0].data_ = (AssertHelperData *)((long)(Type *)local_208._0_8_ + sStack_1f0);
  if ((AssertHelperData *)local_1a8._0_8_ == local_278[0].data_) {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)local_268,(internal *)local_1a8,value,piVar10);
    testing::internal::
    FormatForComparisonFailureMessage<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator,phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>::iterator>
              ((string *)local_298,(internal *)local_278,value_00,piVar10);
    in_R9 = (char *)0x0;
    testing::internal::EqFailure
              ((internal *)&local_2a8,"res.position","t2.end()",(string *)local_268,
               (string *)local_298,false);
    if (local_298 != (undefined1  [8])&local_288) {
      operator_delete((void *)local_298,local_288._M_allocated_capacity + 1);
    }
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
  }
  if (local_2a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_2a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_2a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6db,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_268 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_268 + 8))();
    }
  }
  if (local_2a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a0,local_2a0);
  }
  local_298 = (undefined1  [8])(CONCAT71(local_298._1_7_,local_190[1]) ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_190[1] != '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.node","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dc,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  pcVar14 = "";
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1909e8;
  local_298 = (undefined1  [8])local_98;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_268,local_298,(StringTable *)local_208);
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6dd,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_298 != (undefined1  [8])0x0) {
      (**(code **)((((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_298)->first)._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  local_268 = (undefined1  [8])strlen((char *)local_98);
  aStack_260.slot_ = (slot_type *)local_98;
  uVar7 = std::_Hash_bytes((slot_type *)local_98,(ulong)local_268,0xc70f6907);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  hashval = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
  sVar8 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
          ::_find_key<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
                      *)local_1d8,(basic_string_view<char,_std::char_traits<char>_> *)local_268,
                     hashval);
  if (sVar8 == 0xffffffffffffffff) {
    sVar8 = raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                              *)local_1d8,hashval);
    psVar1 = (string *)(local_1d8._8_8_ + sVar8 * 0x40);
    (((slot_type *)(local_1d8._8_8_ + sVar8 * 0x40))->pair).first._M_dataplus._M_p =
         (pointer)&(((slot_type *)(local_1d8._8_8_ + sVar8 * 0x40))->pair).first.field_2;
    sVar9 = strlen(local_98);
    std::__cxx11::string::_M_construct<char_const*>(psVar1,local_98,local_98 + sVar9);
    *(string **)(psVar1 + 0x20) = psVar1 + 0x30;
    *(undefined2 *)(psVar1 + 0x30) = 0x31;
    *(undefined8 *)(psVar1 + 0x28) = 1;
    if (uStack_1c0 <= sVar8) {
      __assert_fail("i < capacity_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x8fb,
                    "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::StringPolicy, phmap::priv::(anonymous namespace)::StringHash, phmap::priv::(anonymous namespace)::StringEq, std::allocator<int>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::(anonymous namespace)::StringPolicy, Hash = phmap::priv::(anonymous namespace)::StringHash, Eq = phmap::priv::(anonymous namespace)::StringEq, Alloc = std::allocator<int>]"
                   );
    }
    bVar13 = (byte)hashval & 0x7f;
    *(byte *)(local_1d8._0_8_ + sVar8) = bVar13;
    *(byte *)(local_1d8._0_8_ + (ulong)(local_1d8._24_4_ & 0xf) + 1 + (sVar8 - 0x10 & uStack_1c0)) =
         bVar13;
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::extract<char[28],_0>
            ((node_type *)local_268,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_1d8,(key_arg<char[28]> *)local_98);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_e8 + 8),
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_268);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)local_268);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::insert((insert_return_type *)local_268,
           (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
            *)local_208,(node_type *)(local_e8 + 8));
  local_1a8[0x10] = local_258[0];
  local_1a8._0_8_ = local_268;
  local_1a8._8_8_ = aStack_260;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::operator=((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)local_190,
              (node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
               *)(local_258 + 8));
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_258 + 8));
  local_298 = (undefined1  [8])(CONCAT71(local_298._1_7_,local_1a8[0x10]) ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8[0x10] != '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.inserted","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e4,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  pcVar14 = "";
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1909e8;
  local_298 = (undefined1  [8])local_98;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::PairMatcher<char_const*,char_const*>>::operator()
            (local_268,local_298,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)"*res.position");
  if (local_268[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = ((aStack_260.slot_)->pair).first._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e5,pcVar14);
    testing::internal::AssertHelper::operator=(&local_2a8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    if (local_298 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_298 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aStack_260.slot_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_260.slot_);
  }
  local_298[0] = (internal)local_190[1];
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_190[1] == '\0') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)"res.node","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e6,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  local_298 = (undefined1  [8])(CONCAT71(local_298._1_7_,local_df) ^ 1);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_df == '\x01') {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)local_298,(AssertionResult *)0x18880b,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6e7,(char *)local_268);
    testing::internal::AssertHelper::operator=(local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(local_278);
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,(ulong)(local_258._0_8_ + 1));
    }
    if ((long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2a8.data_._1_7_,local_2a8.data_._0_1_) + 8))();
    }
    if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,local_290);
    }
  }
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)local_190);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                   *)local_208);
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
  ::destroy((node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::(anonymous_namespace)::StringPolicy,_void>,_std::allocator<int>_>
             *)(local_e8 + 8));
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                   *)local_1d8);
  return;
}

Assistant:

TEST(Nodes, ExtractInsert) {
  constexpr char k0[] = "Very long std::string zero.";
  constexpr char k1[] = "Very long std::string one.";
  constexpr char k2[] = "Very long std::string two.";
  StringTable t = {{k0, ""}, {k1, ""}, {k2, ""}};
  EXPECT_THAT(t,
              UnorderedElementsAre(Pair(k0, ""), Pair(k1, ""), Pair(k2, "")));

  auto node = t.extract(k0);
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_TRUE(node);
  EXPECT_FALSE(node.empty());

  StringTable t2;
  StringTable::insert_return_type res = t2.insert(std::move(node));
  EXPECT_TRUE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  // Not there.
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  node = t.extract("Not there!");
  EXPECT_THAT(t, UnorderedElementsAre(Pair(k1, ""), Pair(k2, "")));
  EXPECT_FALSE(node);

  // Inserting nothing.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_EQ(res.position, t2.end());
  EXPECT_FALSE(res.node);
  EXPECT_THAT(t2, UnorderedElementsAre(Pair(k0, "")));

  t.emplace(k0, "1");
  node = t.extract(k0);

  // Insert duplicate.
  res = t2.insert(std::move(node));
  EXPECT_FALSE(res.inserted);
  EXPECT_THAT(*res.position, Pair(k0, ""));
  EXPECT_TRUE(res.node);
  EXPECT_FALSE(node);
}